

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::hex_writer::operator()
          (hex_writer *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it
          )

{
  long lVar1;
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> local_30;
  
  lVar1 = *(long *)(*(long *)this + 8);
  internal::
  format_uint<4u,wchar_t,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,unsigned_long>
            (&local_30,*(internal **)(*(long *)this + 0x10),*it,(ulong)*(uint *)(this + 8),
             (uint)(*(char *)(lVar1 + 0x11) != 'x'),SUB81(lVar1,0));
  *(ulong *)((long)&(it->super_truncating_iterator_base<wchar_t_*>).limit_ + 4) =
       CONCAT44((undefined4)local_30.super_truncating_iterator_base<wchar_t_*>.count_,
                local_30.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_);
  *(undefined8 *)((long)&(it->super_truncating_iterator_base<wchar_t_*>).count_ + 4) =
       local_30._20_8_;
  (it->super_truncating_iterator_base<wchar_t_*>).out_ =
       local_30.super_truncating_iterator_base<wchar_t_*>.out_;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ =
       CONCAT44(local_30.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_,
                (undefined4)local_30.super_truncating_iterator_base<wchar_t_*>.limit_);
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<4, char_type>(
              it, self.abs_value, num_digits, self.spec.type != 'x');
      }